

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

iterator __thiscall Disa::Matrix_Sparse::end(Matrix_Sparse *this)

{
  pointer puVar1;
  pointer puVar2;
  size_t extraout_RDX;
  matrix_type *in_RSI;
  size_t i_row;
  iterator iVar3;
  
  puVar1 = (in_RSI->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (in_RSI->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  i_row = 0;
  if (puVar1 != puVar2) {
    i_row = ((long)puVar1 - (long)puVar2 >> 3) - 1;
  }
  Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Row
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)this,i_row,in_RSI);
  iVar3.matrix_row.row_index = extraout_RDX;
  iVar3.matrix_row.matrix = this;
  return (iterator)iVar3.matrix_row;
}

Assistant:

Matrix_Sparse::iterator Matrix_Sparse::end() noexcept {
  return {size_row(), this};
}